

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadialDistrFunc.cpp
# Opt level: O3

void __thiscall OpenMD::RadialDistrFunc::process(RadialDistrFunc *this)

{
  SelectionManager *sman1;
  SelectionManager *sman2;
  SelectionManager *sman2_00;
  pointer piVar1;
  pointer piVar2;
  pointer ppSVar3;
  pointer ppSVar4;
  pointer ppBVar5;
  pointer ppBVar6;
  pointer ppBVar7;
  pointer ppBVar8;
  pointer ppTVar9;
  pointer ppTVar10;
  pointer ppIVar11;
  pointer ppIVar12;
  pointer ppMVar13;
  pointer ppMVar14;
  int iVar15;
  int iVar16;
  int whichFrame;
  long lVar17;
  DumpReader reader;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> local_1398;
  SelectionManager local_1378;
  SelectionEvaluator *local_12a8;
  SelectionEvaluator *local_12a0;
  SelectionManager *local_1298;
  SelectionManager *local_1290;
  DumpReader local_1288;
  
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])();
  DumpReader::DumpReader
            (&local_1288,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  iVar15 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar15 / (this->super_StaticAnalyser).step_;
  if (0 < iVar15) {
    local_12a0 = &this->evaluator1_;
    sman1 = &this->seleMan1_;
    local_12a8 = &this->evaluator2_;
    sman2 = &this->seleMan2_;
    sman2_00 = &this->common_;
    local_1290 = &this->sele1_minus_common_;
    local_1298 = &this->sele2_minus_common_;
    whichFrame = 0;
    do {
      DumpReader::readFrame(&local_1288,whichFrame);
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      if ((this->evaluator1_).isDynamic_ == true) {
        SelectionEvaluator::evaluate((SelectionSet *)&local_1378,local_12a0);
        lVar17 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan1_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar17),(vector<bool,_std::allocator<bool>_> *)
                             ((long)&(local_1378.info_)->_vptr_SimInfo + lVar17));
          lVar17 = lVar17 + 0x28;
        } while (lVar17 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
                   &local_1378);
        (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[0xb])(this,sman1);
      }
      if ((this->evaluator2_).isDynamic_ == true) {
        SelectionEvaluator::evaluate((SelectionSet *)&local_1378,local_12a8);
        lVar17 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan2_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar17),(vector<bool,_std::allocator<bool>_> *)
                             ((long)&(local_1378.info_)->_vptr_SimInfo + lVar17));
          lVar17 = lVar17 + 0x28;
        } while (lVar17 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
                   &local_1378);
        (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[0xc])(this,sman2);
      }
      (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[8])(this);
      if (((this->evaluator1_).isDynamic_ != false) || ((this->evaluator2_).isDynamic_ == true)) {
        operator&(&local_1378,sman1,sman2);
        local_1398.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (this->common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_1398.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (this->common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        local_1398.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (this->common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        (this->common_).info_ = local_1378.info_;
        (this->common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        (this->common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        (this->common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_1378.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1378.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1398);
        piVar1 = (this->common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2 = (this->common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (this->common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        (this->common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (this->common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if (piVar1 != (pointer)0x0) {
          operator_delete(piVar1,(long)piVar2 - (long)piVar1);
        }
        ppSVar3 = (this->common_).stuntdoubles_.
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppSVar4 = (this->common_).stuntdoubles_.
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->common_).stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.stuntdoubles_.
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (this->common_).stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.stuntdoubles_.
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (this->common_).stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.stuntdoubles_.
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1378.stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppSVar3 != (pointer)0x0) {
          operator_delete(ppSVar3,(long)ppSVar4 - (long)ppSVar3);
        }
        ppBVar5 = (this->common_).bonds_.
                  super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppBVar6 = (this->common_).bonds_.
                  super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        (this->common_).bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (this->common_).bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (this->common_).bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppBVar5 != (pointer)0x0) {
          operator_delete(ppBVar5,(long)ppBVar6 - (long)ppBVar5);
        }
        ppBVar7 = (this->common_).bends_.
                  super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppBVar8 = (this->common_).bends_.
                  super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        (this->common_).bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (this->common_).bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (this->common_).bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppBVar7 != (pointer)0x0) {
          operator_delete(ppBVar7,(long)ppBVar8 - (long)ppBVar7);
        }
        ppTVar9 = (this->common_).torsions_.
                  super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppTVar10 = (this->common_).torsions_.
                   super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
        (this->common_).torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.torsions_.
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        (this->common_).torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.torsions_.
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (this->common_).torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.torsions_.
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1378.torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppTVar9 != (pointer)0x0) {
          operator_delete(ppTVar9,(long)ppTVar10 - (long)ppTVar9);
        }
        ppIVar11 = (this->common_).inversions_.
                   super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppIVar12 = (this->common_).inversions_.
                   super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->common_).inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.inversions_.
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        (this->common_).inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.inversions_.
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (this->common_).inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.inversions_.
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1378.inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppIVar11 != (pointer)0x0) {
          operator_delete(ppIVar11,(long)ppIVar12 - (long)ppIVar11);
        }
        ppMVar13 = (this->common_).molecules_.
                   super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppMVar14 = (this->common_).molecules_.
                   super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->common_).molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.molecules_.
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        (this->common_).molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.molecules_.
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (this->common_).molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.molecules_.
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1378.molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppMVar13 != (pointer)0x0) {
          operator_delete(ppMVar13,(long)ppMVar14 - (long)ppMVar13);
        }
        SelectionManager::~SelectionManager(&local_1378);
        operator-(&local_1378,sman1,sman2_00);
        local_1398.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (this->sele1_minus_common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_1398.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (this->sele1_minus_common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        local_1398.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (this->sele1_minus_common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        (this->sele1_minus_common_).info_ = local_1378.info_;
        (this->sele1_minus_common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        (this->sele1_minus_common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        (this->sele1_minus_common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_1378.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1378.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1398);
        piVar1 = (this->sele1_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar2 = (this->sele1_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->sele1_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        (this->sele1_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (this->sele1_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if (piVar1 != (pointer)0x0) {
          operator_delete(piVar1,(long)piVar2 - (long)piVar1);
        }
        ppSVar3 = (this->sele1_minus_common_).stuntdoubles_.
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppSVar4 = (this->sele1_minus_common_).stuntdoubles_.
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->sele1_minus_common_).stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.stuntdoubles_.
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (this->sele1_minus_common_).stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.stuntdoubles_.
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (this->sele1_minus_common_).stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.stuntdoubles_.
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1378.stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppSVar3 != (pointer)0x0) {
          operator_delete(ppSVar3,(long)ppSVar4 - (long)ppSVar3);
        }
        ppBVar5 = (this->sele1_minus_common_).bonds_.
                  super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppBVar6 = (this->sele1_minus_common_).bonds_.
                  super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        (this->sele1_minus_common_).bonds_.
        super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (this->sele1_minus_common_).bonds_.
        super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (this->sele1_minus_common_).bonds_.
        super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppBVar5 != (pointer)0x0) {
          operator_delete(ppBVar5,(long)ppBVar6 - (long)ppBVar5);
        }
        ppBVar7 = (this->sele1_minus_common_).bends_.
                  super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppBVar8 = (this->sele1_minus_common_).bends_.
                  super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        (this->sele1_minus_common_).bends_.
        super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (this->sele1_minus_common_).bends_.
        super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (this->sele1_minus_common_).bends_.
        super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppBVar7 != (pointer)0x0) {
          operator_delete(ppBVar7,(long)ppBVar8 - (long)ppBVar7);
        }
        ppTVar9 = (this->sele1_minus_common_).torsions_.
                  super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppTVar10 = (this->sele1_minus_common_).torsions_.
                   super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
        (this->sele1_minus_common_).torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.torsions_.
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        (this->sele1_minus_common_).torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.torsions_.
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (this->sele1_minus_common_).torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.torsions_.
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1378.torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppTVar9 != (pointer)0x0) {
          operator_delete(ppTVar9,(long)ppTVar10 - (long)ppTVar9);
        }
        ppIVar11 = (this->sele1_minus_common_).inversions_.
                   super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppIVar12 = (this->sele1_minus_common_).inversions_.
                   super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->sele1_minus_common_).inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.inversions_.
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        (this->sele1_minus_common_).inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.inversions_.
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (this->sele1_minus_common_).inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.inversions_.
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1378.inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppIVar11 != (pointer)0x0) {
          operator_delete(ppIVar11,(long)ppIVar12 - (long)ppIVar11);
        }
        ppMVar13 = (this->sele1_minus_common_).molecules_.
                   super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppMVar14 = (this->sele1_minus_common_).molecules_.
                   super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->sele1_minus_common_).molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.molecules_.
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        (this->sele1_minus_common_).molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.molecules_.
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (this->sele1_minus_common_).molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.molecules_.
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1378.molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppMVar13 != (pointer)0x0) {
          operator_delete(ppMVar13,(long)ppMVar14 - (long)ppMVar13);
        }
        SelectionManager::~SelectionManager(&local_1378);
        operator-(&local_1378,sman2,sman2_00);
        local_1398.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (this->sele2_minus_common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_1398.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (this->sele2_minus_common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        local_1398.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (this->sele2_minus_common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        (this->sele2_minus_common_).info_ = local_1378.info_;
        (this->sele2_minus_common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        (this->sele2_minus_common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        (this->sele2_minus_common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_1378.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1378.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1398);
        piVar1 = (this->sele2_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar2 = (this->sele2_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->sele2_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        (this->sele2_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (this->sele2_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if (piVar1 != (pointer)0x0) {
          operator_delete(piVar1,(long)piVar2 - (long)piVar1);
        }
        ppSVar3 = (this->sele2_minus_common_).stuntdoubles_.
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppSVar4 = (this->sele2_minus_common_).stuntdoubles_.
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->sele2_minus_common_).stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.stuntdoubles_.
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (this->sele2_minus_common_).stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.stuntdoubles_.
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (this->sele2_minus_common_).stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.stuntdoubles_.
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1378.stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.stuntdoubles_.
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppSVar3 != (pointer)0x0) {
          operator_delete(ppSVar3,(long)ppSVar4 - (long)ppSVar3);
        }
        ppBVar5 = (this->sele2_minus_common_).bonds_.
                  super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppBVar6 = (this->sele2_minus_common_).bonds_.
                  super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        (this->sele2_minus_common_).bonds_.
        super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (this->sele2_minus_common_).bonds_.
        super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (this->sele2_minus_common_).bonds_.
        super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppBVar5 != (pointer)0x0) {
          operator_delete(ppBVar5,(long)ppBVar6 - (long)ppBVar5);
        }
        ppBVar7 = (this->sele2_minus_common_).bends_.
                  super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppBVar8 = (this->sele2_minus_common_).bends_.
                  super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        (this->sele2_minus_common_).bends_.
        super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (this->sele2_minus_common_).bends_.
        super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (this->sele2_minus_common_).bends_.
        super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppBVar7 != (pointer)0x0) {
          operator_delete(ppBVar7,(long)ppBVar8 - (long)ppBVar7);
        }
        ppTVar9 = (this->sele2_minus_common_).torsions_.
                  super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppTVar10 = (this->sele2_minus_common_).torsions_.
                   super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
        (this->sele2_minus_common_).torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.torsions_.
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        (this->sele2_minus_common_).torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.torsions_.
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (this->sele2_minus_common_).torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.torsions_.
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1378.torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.torsions_.
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppTVar9 != (pointer)0x0) {
          operator_delete(ppTVar9,(long)ppTVar10 - (long)ppTVar9);
        }
        ppIVar11 = (this->sele2_minus_common_).inversions_.
                   super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppIVar12 = (this->sele2_minus_common_).inversions_.
                   super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->sele2_minus_common_).inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.inversions_.
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        (this->sele2_minus_common_).inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.inversions_.
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (this->sele2_minus_common_).inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.inversions_.
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1378.inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.inversions_.
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppIVar11 != (pointer)0x0) {
          operator_delete(ppIVar11,(long)ppIVar12 - (long)ppIVar11);
        }
        ppMVar13 = (this->sele2_minus_common_).molecules_.
                   super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppMVar14 = (this->sele2_minus_common_).molecules_.
                   super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->sele2_minus_common_).molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1378.molecules_.
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        (this->sele2_minus_common_).molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1378.molecules_.
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (this->sele2_minus_common_).molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1378.molecules_.
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1378.molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1378.molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1378.molecules_.
        super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppMVar13 != (pointer)0x0) {
          operator_delete(ppMVar13,(long)ppMVar14 - (long)ppMVar13);
        }
        SelectionManager::~SelectionManager(&local_1378);
        iVar16 = OpenMDBitSet::countBits
                           ((this->seleMan1_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start);
        this->nSelected1_ = iVar16;
        iVar16 = OpenMDBitSet::countBits
                           ((this->seleMan2_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start);
        this->nSelected2_ = iVar16;
        iVar16 = OpenMDBitSet::countBits
                           ((this->common_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start);
        this->nPairs_ = this->nSelected2_ * this->nSelected1_ - ((iVar16 + 1) * iVar16) / 2;
      }
      (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[6])(this,local_1290,sman2);
      (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[6])(this,sman2_00,local_1298);
      (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[7])(this,sman2_00);
      (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[10])(this);
      whichFrame = whichFrame + (this->super_StaticAnalyser).step_;
    } while (whichFrame < iVar15);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[5])(this);
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[0xd])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void RadialDistrFunc::process() {
    preProcess();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int i = 0; i < nFrames; i += step_) {
      reader.readFrame(i);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
        validateSelection1(seleMan1_);
      }
      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
        validateSelection2(seleMan2_);
      }

      initializeHistogram();

      // Selections may overlap, and we need a bit of logic to deal
      // with this.
      //
      // |     s1    |
      // | s1 -c | c |
      //         | c | s2 - c |
      //         |    s2      |
      //
      // s1 : Set of StuntDoubles in selection1
      // s2 : Set of StuntDoubles in selection2
      // c  : Intersection of selection1 and selection2
      //
      // When we loop over the pairs, we can divide the looping into 3
      // stages:
      //
      // Stage 1 :     [s1-c]      [s2]
      // Stage 2 :     [c]         [s2 - c]
      // Stage 3 :     [c]         [c]
      // Stages 1 and 2 are completely non-overlapping.
      // Stage 3 is completely overlapping.

      if (evaluator1_.isDynamic() || evaluator2_.isDynamic()) {
        common_             = seleMan1_ & seleMan2_;
        sele1_minus_common_ = seleMan1_ - common_;
        sele2_minus_common_ = seleMan2_ - common_;
        nSelected1_         = seleMan1_.getSelectionCount();
        nSelected2_         = seleMan2_.getSelectionCount();
        int nIntersect      = common_.getSelectionCount();

        nPairs_ = nSelected1_ * nSelected2_ - (nIntersect + 1) * nIntersect / 2;
      }

      processNonOverlapping(sele1_minus_common_, seleMan2_);
      processNonOverlapping(common_, sele2_minus_common_);
      processOverlapping(common_);

      processHistogram();
    }

    postProcess();

    writeRdf();
  }